

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseGraph.cpp
# Opt level: O3

void PrintEnterBlock(ParseGraphContext *ctx,char *name)

{
  OutputContext *this;
  size_t sVar1;
  
  PrintIndent(ctx);
  if (*name != '\0') {
    this = ctx->output;
    sVar1 = strlen(name);
    OutputContext::Print(this,name,(uint)sVar1);
    OutputContext::Print(ctx->output,": ",2);
  }
  OutputContext::Print(ctx->output,"{\n",2);
  ctx->depth = ctx->depth + 1;
  return;
}

Assistant:

void PrintEnterBlock(ParseGraphContext &ctx, const char *name)
{
	PrintIndent(ctx);

	if(*name)
	{
		ctx.output.Print(name);
		ctx.output.Print(": ");
	}

	ctx.output.Print("{\n");

	ctx.depth++;
}